

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_hostapi_skeleton.c
# Opt level: O0

PaError WriteStream(PaStream *s,void *buffer,unsigned_long frames)

{
  PaSkeletonStream *stream;
  unsigned_long frames_local;
  void *buffer_local;
  PaStream *s_local;
  
  return 0;
}

Assistant:

static PaError WriteStream( PaStream* s,
                            const void *buffer,
                            unsigned long frames )
{
    PaSkeletonStream *stream = (PaSkeletonStream*)s;

    /* suppress unused variable warnings */
    (void) buffer;
    (void) frames;
    (void) stream;
    
    /* IMPLEMENT ME, see portaudio.h for required behavior*/

    return paNoError;
}